

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm.cpp
# Opt level: O3

pair<bool,_bool> anon_unknown.dwarf_6c3c21::has_extdir_or_ho(BCRec *bcrec,int ncomp,int dir)

{
  int iVar1;
  pair<bool,_bool> pVar2;
  long lVar3;
  ushort uVar4;
  bool bVar5;
  bool bVar6;
  
  if (0 < ncomp) {
    lVar3 = 0;
    bVar6 = false;
    uVar4 = 0;
    do {
      bVar5 = uVar4 == 0;
      uVar4 = 1;
      if (bVar5) {
        iVar1 = *(int *)((long)bcrec->bc + lVar3 + (long)dir * 4);
        uVar4 = 1;
        if (iVar1 != 3) {
          uVar4 = (ushort)(iVar1 == 4);
        }
      }
      if (bVar6 == false) {
        iVar1 = *(int *)((long)bcrec->bc + lVar3 + (long)(dir + 3) * 4);
        bVar6 = true;
        if (iVar1 != 3) {
          bVar6 = iVar1 == 4;
        }
      }
      else {
        bVar6 = true;
      }
      lVar3 = lVar3 + 0x18;
    } while ((ulong)(uint)ncomp * 0x18 != lVar3);
    return (pair<bool,_bool>)(uVar4 | (ushort)bVar6 << 8);
  }
  pVar2.first = false;
  pVar2.second = false;
  return pVar2;
}

Assistant:

std::pair<bool,bool> has_extdir_or_ho (BCRec const* bcrec, int ncomp, int dir)
    {
        std::pair<bool,bool> r{false,false};
        for (int n = 0; n < ncomp; ++n) {
            r.first = r.first
                 || (bcrec[n].lo(dir) == BCType::ext_dir)
                 || (bcrec[n].lo(dir) == BCType::hoextrap);
            r.second = r.second
                 || (bcrec[n].hi(dir) == BCType::ext_dir)
                 || (bcrec[n].hi(dir) == BCType::hoextrap);
        }
        return r;
    }